

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *local_58;
  ImGuiWindow *local_50;
  int local_3c;
  int n_1;
  ImGuiWindow *window;
  ImGuiWindow *pIStack_28;
  int n;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0xfdd,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar1->FrameCountRendered = pIVar1->FrameCount;
  (pIVar1->IO).MetricsRenderWindows = 0;
  (pIVar1->IO).MetricsRenderIndices = 0;
  (pIVar1->IO).MetricsRenderVertices = 0;
  ImDrawDataBuilder::Clear(&pIVar1->DrawDataBuilder);
  bVar2 = ImVector<ImDrawVert>::empty(&(pIVar1->BackgroundDrawList).VtxBuffer);
  if (!bVar2) {
    AddDrawListToDrawData((pIVar1->DrawDataBuilder).Layers,&pIVar1->BackgroundDrawList);
  }
  if ((pIVar1->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     ((pIVar1->NavWindowingTarget->Flags & 0x2000U) != 0)) {
    local_50 = (ImGuiWindow *)0x0;
  }
  else {
    local_50 = pIVar1->NavWindowingTarget->RootWindow;
  }
  pIStack_28 = local_50;
  if (pIVar1->NavWindowingTarget == (ImGuiWindow *)0x0) {
    local_58 = (ImGuiWindow *)0x0;
  }
  else {
    local_58 = pIVar1->NavWindowingList;
  }
  windows_to_render_top_most[0] = local_58;
  for (window._4_4_ = 0; window._4_4_ != (pIVar1->Windows).Size; window._4_4_ = window._4_4_ + 1) {
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,window._4_4_);
    window_00 = *ppIVar3;
    bVar2 = IsWindowActiveAndVisible(window_00);
    if ((((bVar2) && ((window_00->Flags & 0x1000000U) == 0)) && (window_00 != pIStack_28)) &&
       (window_00 != windows_to_render_top_most[0])) {
      AddRootWindowToDrawData(window_00);
    }
  }
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    if ((*(long *)((long)&stack0xffffffffffffffd8 + (long)local_3c * 8) != 0) &&
       (bVar2 = IsWindowActiveAndVisible
                          (*(ImGuiWindow **)((long)&stack0xffffffffffffffd8 + (long)local_3c * 8)),
       bVar2)) {
      AddRootWindowToDrawData
                (*(ImGuiWindow **)((long)&stack0xffffffffffffffd8 + (long)local_3c * 8));
    }
  }
  ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar1->DrawDataBuilder);
  if (((pIVar1->IO).MouseDrawCursor & 1U) != 0) {
    RenderMouseCursor(&pIVar1->ForegroundDrawList,(pIVar1->IO).MousePos,
                      (pIVar1->Style).MouseCursorScale,pIVar1->MouseCursor,0xffffffff,0xff000000,
                      0x30000000);
  }
  bVar2 = ImVector<ImDrawVert>::empty(&(pIVar1->ForegroundDrawList).VtxBuffer);
  if (!bVar2) {
    AddDrawListToDrawData((pIVar1->DrawDataBuilder).Layers,&pIVar1->ForegroundDrawList);
  }
  SetupDrawData((pIVar1->DrawDataBuilder).Layers,&pIVar1->DrawData);
  (pIVar1->IO).MetricsRenderVertices = (pIVar1->DrawData).TotalVtxCount;
  (pIVar1->IO).MetricsRenderIndices = (pIVar1->DrawData).TotalIdxCount;
  if ((0 < (pIVar1->DrawData).CmdListsCount) &&
     ((pIVar1->IO).RenderDrawListsFn != (_func_void_ImDrawData_ptr *)0x0)) {
    (*(pIVar1->IO).RenderDrawListsFn)(&pIVar1->DrawData);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather ImDrawList to render (for each active window)
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = g.NavWindowingTarget ? g.NavWindowingList : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}